

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnRefNullExpr
          (ExprVisitorDelegate *this,RefNullExpr *expr)

{
  WatWriter *pWVar1;
  char *pcVar2;
  Type local_20;
  
  pWVar1 = this->writer_;
  pcVar2 = Opcode::GetName((Opcode *)&Opcode::RefNull_Opcode);
  WritePutsSpace(pWVar1,pcVar2);
  pWVar1 = this->writer_;
  local_20 = expr->type;
  pcVar2 = Type::GetRefKindName(&local_20);
  WritePuts(pWVar1,pcVar2,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnRefNullExpr(RefNullExpr* expr) {
  writer_->WritePutsSpace(Opcode::RefNull_Opcode.GetName());
  writer_->WriteRefKind(expr->type, NextChar::Newline);
  return Result::Ok;
}